

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOServer.cpp
# Opt level: O3

int __thiscall mognetwork::TcpASIOServer::init(TcpASIOServer *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TcpASIOListener *this_00;
  TcpASIOWriter *this_01;
  
  this_00 = (TcpASIOListener *)operator_new(0x1f0);
  TcpASIOListener::TcpASIOListener(this_00,this);
  this->m_serverListener = this_00;
  this_01 = (TcpASIOWriter *)operator_new(0x220);
  TcpASIOWriter::TcpASIOWriter(this_01,this);
  this->m_serverWriter = this_01;
  TcpASIOListener::setProtocolFactory(this->m_serverListener,this->m_protocolFactory);
  return extraout_EAX;
}

Assistant:

void TcpASIOServer::init()
  {
	  m_serverListener = new TcpASIOListener(this);
	  m_serverWriter = new TcpASIOWriter(this);
	  m_serverListener->setProtocolFactory(m_protocolFactory);
  }